

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

void __thiscall ON_BrepFace::DestroyMesh(ON_BrepFace *this,mesh_type mt)

{
  recursive_mutex *__mutex;
  Impl *this_00;
  
  __mutex = &this->m_pImpl->m_mesh_mutex;
  std::recursive_mutex::lock(__mutex);
  this_00 = this->m_pImpl;
  if (mt != render_mesh) {
    if (mt != preview_mesh) {
      if (mt == analysis_mesh) {
        this_00 = (Impl *)&this_00->m_analysis_mesh;
        goto LAB_00410e70;
      }
      std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)this_00);
      std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(this->m_pImpl->m_analysis_mesh).
                  super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>);
      this_00 = this->m_pImpl;
    }
    this_00 = (Impl *)&this_00->m_preview_mesh;
  }
LAB_00410e70:
  std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)this_00);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void ON_BrepFace::DestroyMesh(ON::mesh_type mt)
{
  std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);

  switch(mt) {
  case ON::render_mesh:
    m_pImpl->m_render_mesh.reset();
    break;
  case ON::analysis_mesh:
    m_pImpl->m_analysis_mesh.reset();
    break;
  case ON::preview_mesh:
    m_pImpl->m_preview_mesh.reset();
    break;
  default:
    m_pImpl->m_render_mesh.reset();
    m_pImpl->m_analysis_mesh.reset();
    m_pImpl->m_preview_mesh.reset();
    break;
  }
}